

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

void FreeMemoryLiteral(ExpressionEvalContext *ctx,ExprMemoryLiteral *memory)

{
  uint uVar1;
  ExprPointerLiteral **ppEVar2;
  ExprPointerLiteral *pEVar3;
  
  uVar1 = (ctx->abandonedMemory).count;
  if (uVar1 == (ctx->abandonedMemory).max) {
    SmallArray<ExprPointerLiteral_*,_32U>::grow(&ctx->abandonedMemory,uVar1);
  }
  ppEVar2 = (ctx->abandonedMemory).data;
  if (ppEVar2 != (ExprPointerLiteral **)0x0) {
    pEVar3 = memory->ptr;
    uVar1 = (ctx->abandonedMemory).count;
    (ctx->abandonedMemory).count = uVar1 + 1;
    ppEVar2[uVar1] = pEVar3;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ExprPointerLiteral *, 32>::push_back(const T &) [T = ExprPointerLiteral *, N = 32]"
               );
}

Assistant:

void FreeMemoryLiteral(ExpressionEvalContext &ctx, ExprMemoryLiteral *memory)
{
	ctx.abandonedMemory.push_back(memory->ptr);
}